

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

void CollectColorBlueTransforms_SSE2
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_blue,
               int red_to_blue,int *histo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint tile_width_00;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char local_4c;
  undefined1 local_48 [16];
  uint16_t values [8];
  
  auVar3 = _DAT_00156b10;
  auVar2 = _DAT_00151c40;
  if (0 < tile_height) {
    iVar5 = ((int)(char)green_to_blue & 0x1fffU) * 8;
    auVar9._4_4_ = iVar5;
    auVar9._0_4_ = iVar5;
    auVar9._8_4_ = iVar5;
    auVar9._12_4_ = iVar5;
    local_4c = (char)red_to_blue;
    iVar5 = (int)local_4c;
    auVar10._0_4_ = iVar5 << 0x13;
    auVar10._4_4_ = iVar5 << 0x13;
    auVar10._8_4_ = iVar5 << 0x13;
    auVar10._12_4_ = iVar5 << 0x13;
    uVar8 = 0;
    do {
      if (7 < tile_width) {
        lVar6 = 8;
        lVar7 = 0;
        do {
          auVar11 = *(undefined1 (*) [16])(argb + uVar8 * (long)stride + lVar7);
          auVar1 = *(undefined1 (*) [16])(argb + uVar8 * (long)stride + lVar7 + 4);
          auVar12 = psllw(auVar11,8);
          auVar14 = psllw(auVar1,8);
          auVar13 = pmulhw(auVar12,auVar10);
          auVar14 = pmulhw(auVar14,auVar10);
          auVar15 = pmulhw(auVar11 & auVar3,auVar9);
          auVar16 = pmulhw(auVar1 & auVar3,auVar9);
          auVar12[0] = auVar11[0] - (auVar13[2] + auVar15[0]);
          auVar12[1] = auVar11[1] - (auVar13[3] + auVar15[1]);
          auVar12[2] = auVar11[2] - auVar15[2];
          auVar12[3] = auVar11[3] - auVar15[3];
          auVar12[4] = auVar11[4] - (auVar13[6] + auVar15[4]);
          auVar12[5] = auVar11[5] - (auVar13[7] + auVar15[5]);
          auVar12[6] = auVar11[6] - auVar15[6];
          auVar12[7] = auVar11[7] - auVar15[7];
          auVar12[8] = auVar11[8] - (auVar13[10] + auVar15[8]);
          auVar12[9] = auVar11[9] - (auVar13[0xb] + auVar15[9]);
          auVar12[10] = auVar11[10] - auVar15[10];
          auVar12[0xb] = auVar11[0xb] - auVar15[0xb];
          auVar12[0xc] = auVar11[0xc] - (auVar13[0xe] + auVar15[0xc]);
          auVar12[0xd] = auVar11[0xd] - (auVar13[0xf] + auVar15[0xd]);
          auVar12[0xe] = auVar11[0xe] - auVar15[0xe];
          auVar12[0xf] = auVar11[0xf] - auVar15[0xf];
          auVar11[0] = auVar1[0] - (auVar14[2] + auVar16[0]);
          auVar11[1] = auVar1[1] - (auVar14[3] + auVar16[1]);
          auVar11[2] = auVar1[2] - auVar16[2];
          auVar11[3] = auVar1[3] - auVar16[3];
          auVar11[4] = auVar1[4] - (auVar14[6] + auVar16[4]);
          auVar11[5] = auVar1[5] - (auVar14[7] + auVar16[5]);
          auVar11[6] = auVar1[6] - auVar16[6];
          auVar11[7] = auVar1[7] - auVar16[7];
          auVar11[8] = auVar1[8] - (auVar14[10] + auVar16[8]);
          auVar11[9] = auVar1[9] - (auVar14[0xb] + auVar16[9]);
          auVar11[10] = auVar1[10] - auVar16[10];
          auVar11[0xb] = auVar1[0xb] - auVar16[0xb];
          auVar11[0xc] = auVar1[0xc] - (auVar14[0xe] + auVar16[0xc]);
          auVar11[0xd] = auVar1[0xd] - (auVar14[0xf] + auVar16[0xd]);
          auVar11[0xe] = auVar1[0xe] - auVar16[0xe];
          auVar11[0xf] = auVar1[0xf] - auVar16[0xf];
          local_48 = packssdw(auVar12 & auVar2,auVar11 & auVar2);
          lVar4 = 0;
          do {
            histo[*(ushort *)(local_48 + lVar4 * 2)] = histo[*(ushort *)(local_48 + lVar4 * 2)] + 1;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          lVar6 = lVar6 + 8;
          lVar7 = lVar7 + 8;
        } while (lVar6 <= tile_width);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)tile_height);
  }
  tile_width_00 = tile_width & 7;
  if (tile_width_00 != 0) {
    VP8LCollectColorBlueTransforms_C
              ((uint32_t *)((long)argb + ((long)tile_width * 4 - (ulong)(tile_width_00 * 4))),stride
               ,tile_width_00,tile_height,green_to_blue,red_to_blue,histo);
    return;
  }
  return;
}

Assistant:

static void CollectColorBlueTransforms_SSE2(const uint32_t* argb, int stride,
                                            int tile_width, int tile_height,
                                            int green_to_blue, int red_to_blue,
                                            int histo[]) {
  const __m128i mults_r = MK_CST_16(CST_5b(red_to_blue), 0);
  const __m128i mults_g = MK_CST_16(0, CST_5b(green_to_blue));
  const __m128i mask_g = _mm_set1_epi32(0x00ff00);  // green mask
  const __m128i mask_b = _mm_set1_epi32(0x0000ff);  // blue mask
  int y;
  for (y = 0; y < tile_height; ++y) {
    const uint32_t* const src = argb + y * stride;
    int i, x;
    for (x = 0; x + SPAN <= tile_width; x += SPAN) {
      uint16_t values[SPAN];
      const __m128i in0 = _mm_loadu_si128((__m128i*)&src[x +        0]);
      const __m128i in1 = _mm_loadu_si128((__m128i*)&src[x + SPAN / 2]);
      const __m128i A0 = _mm_slli_epi16(in0, 8);        // r 0  | b 0
      const __m128i A1 = _mm_slli_epi16(in1, 8);
      const __m128i B0 = _mm_and_si128(in0, mask_g);    // 0 0  | g 0
      const __m128i B1 = _mm_and_si128(in1, mask_g);
      const __m128i C0 = _mm_mulhi_epi16(A0, mults_r);  // x db | 0 0
      const __m128i C1 = _mm_mulhi_epi16(A1, mults_r);
      const __m128i D0 = _mm_mulhi_epi16(B0, mults_g);  // 0 0  | x db
      const __m128i D1 = _mm_mulhi_epi16(B1, mults_g);
      const __m128i E0 = _mm_sub_epi8(in0, D0);         // x x  | x b'
      const __m128i E1 = _mm_sub_epi8(in1, D1);
      const __m128i F0 = _mm_srli_epi32(C0, 16);        // 0 0  | x db
      const __m128i F1 = _mm_srli_epi32(C1, 16);
      const __m128i G0 = _mm_sub_epi8(E0, F0);          // 0 0  | x b'
      const __m128i G1 = _mm_sub_epi8(E1, F1);
      const __m128i H0 = _mm_and_si128(G0, mask_b);     // 0 0  | 0 b
      const __m128i H1 = _mm_and_si128(G1, mask_b);
      const __m128i I = _mm_packs_epi32(H0, H1);        // 0 b' | 0 b'
      _mm_storeu_si128((__m128i*)values, I);
      for (i = 0; i < SPAN; ++i) ++histo[values[i]];
    }
  }
  {
    const int left_over = tile_width & (SPAN - 1);
    if (left_over > 0) {
      VP8LCollectColorBlueTransforms_C(argb + tile_width - left_over, stride,
                                       left_over, tile_height,
                                       green_to_blue, red_to_blue, histo);
    }
  }
}